

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::genGatherPrograms
               (SourceCollections *programCollection,GatherCaseBaseParams *baseParams,
               vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
               *iterations)

{
  GatherType GVar1;
  ChannelOrder CVar2;
  TextureType_conflict TVar3;
  GatherType GVar4;
  OffsetSize OVar5;
  ImageBackingMode IVar6;
  int iVar7;
  DataType dataType;
  ulong uVar8;
  ostream *poVar9;
  ProgramSources *pPVar10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  int iVar13;
  Vector<int,_2> *value;
  Vector<int,_2> *value_00;
  Vector<int,_2> *value_01;
  Vector<int,_2> *value_02;
  Vector<int,_2> *value_03;
  DataType dataType_00;
  string *this;
  pointer value_04;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool local_5a1;
  int local_58c;
  int local_584;
  string funcCall;
  string texCoordType;
  string texCoordType_1;
  string local_500;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  *local_4e0;
  long local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string outType;
  string refZExpr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  VertexSource vert;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream vert_1;
  
  local_4d8 = ((long)(iterations->
                     super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(iterations->
                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x24;
  local_4e0 = iterations;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&refZExpr,"v_normalizedCoord.x",(allocator<char> *)&vert_1);
  uVar8 = (ulong)baseParams->offsetSize;
  if (uVar8 < 3) {
    local_58c = *(int *)(&DAT_0099bf7c + uVar8 * 4);
    iVar7 = *(int *)(&DAT_0099bf88 + uVar8 * 4);
  }
  else {
    local_58c = 0;
    iVar7 = -1;
  }
  GVar1 = baseParams->gatherType;
  CVar2 = (baseParams->textureFormat).order;
  local_5a1 = GVar1 == GATHERTYPE_OFFSET_DYNAMIC || (CVar2 - D & 0xfffffffd) == 0;
  bVar14 = CVar2 == D;
  TVar3 = baseParams->textureType;
  uVar8 = (ulong)TVar3;
  bVar15 = CVar2 == DS;
  if ((bVar15) || (CVar2 == D)) {
    if (TVar3 < TEXTURETYPE_LAST) {
      dataType = *(DataType *)(&DAT_0099bf94 + uVar8 * 4);
    }
    else {
      dataType = TYPE_LAST;
    }
  }
  else if (TVar3 == TEXTURETYPE_CUBE) {
    dataType = glu::getSamplerCubeType(baseParams->textureFormat);
  }
  else if (TVar3 == TEXTURETYPE_2D_ARRAY) {
    dataType = glu::getSampler2DArrayType(baseParams->textureFormat);
  }
  else {
    if (TVar3 != TEXTURETYPE_2D) {
      dataType = TYPE_LAST;
      goto LAB_006073df;
    }
    dataType = glu::getSampler2DType(baseParams->textureFormat);
  }
  uVar8 = (ulong)baseParams->textureType;
LAB_006073df:
  if ((uint)uVar8 < 3) {
    iVar13 = *(int *)(&DAT_0099bfa0 + uVar8 * 4);
  }
  else {
    iVar13 = -1;
  }
  bVar16 = GVar1 == GATHERTYPE_OFFSET_DYNAMIC;
  GVar4 = baseParams->gatherType;
  OVar5 = baseParams->offsetSize;
  outType._M_dataplus._M_p._0_4_ = iVar13;
  de::toString<int>((string *)&vert_1,(int *)&outType);
  std::operator+(&texCoordType,"vec",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1);
  std::__cxx11::string::~string((string *)&vert_1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vert_1);
  std::operator<<((ostream *)&vert_1,"#version 310 es\n");
  if ((GVar4 & ~GATHERTYPE_OFFSET) == GATHERTYPE_OFFSET_DYNAMIC ||
      OVar5 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    std::operator<<((ostream *)&vert_1,"#extension GL_EXT_gpu_shader5 : require\n");
  }
  poVar9 = std::operator<<((ostream *)&vert_1,
                           "\nlayout (location = 0) in highp vec2 a_position;\nlayout (location = 1) in highp "
                          );
  poVar9 = std::operator<<(poVar9,(string *)&texCoordType);
  std::operator<<(poVar9," a_texCoord;\n");
  if (bVar16 || (bVar14 || bVar15)) {
    std::operator<<((ostream *)&vert_1,
                    "layout (location = 2) in highp vec2 a_normalizedCoord; // (0,0) to (1,1)\n");
  }
  poVar9 = std::operator<<((ostream *)&vert_1,"\nlayout (location = 0) out highp ");
  poVar9 = std::operator<<(poVar9,(string *)&texCoordType);
  std::operator<<(poVar9," v_texCoord;\n");
  if (bVar16 || (bVar14 || bVar15)) {
    std::operator<<((ostream *)&vert_1,"layout (location = 1) out highp vec2 v_normalizedCoord;\n");
  }
  std::operator<<((ostream *)&vert_1,
                  "\nvoid main (void)\n{\n\tgl_Position = vec4(a_position.x, a_position.y, 0.0, 1.0);\n\tv_texCoord = a_texCoord;\n"
                 );
  if (bVar16 || (bVar14 || bVar15)) {
    std::operator<<((ostream *)&vert_1,"\tv_normalizedCoord = a_normalizedCoord;\n");
  }
  std::operator<<((ostream *)&vert_1,"}\n");
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource(&vert,&texCoordType_1);
  std::__cxx11::string::~string((string *)&texCoordType_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vert_1);
  std::__cxx11::string::~string((string *)&texCoordType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vert_1,"vert",(allocator<char> *)&texCoordType);
  pPVar10 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1)
  ;
  glu::ProgramSources::operator<<(pPVar10,&vert.super_ShaderSource);
  std::__cxx11::string::~string((string *)&vert_1);
  local_584 = 0;
  do {
    if ((int)local_4d8 <= local_584) {
      std::__cxx11::string::~string((string *)&vert.super_ShaderSource.source);
      std::__cxx11::string::~string((string *)&refZExpr);
      return;
    }
    value_04 = (local_4e0->
               super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
               )._M_impl.super__Vector_impl_data._M_start + local_584;
    GVar4 = baseParams->gatherType;
    OVar5 = baseParams->offsetSize;
    IVar6 = baseParams->sparseCase;
    funcCall._M_string_length = 0;
    funcCall._M_dataplus._M_p = (pointer)&funcCall.field_2;
    funcCall.field_2._M_local_buf[0] = '\0';
    if (GVar4 < GATHERTYPE_LAST) {
      std::__cxx11::string::append((char *)&funcCall);
    }
    std::__cxx11::string::append((char *)&funcCall);
    CVar2 = (baseParams->textureFormat).order;
    if ((CVar2 == DS) || (CVar2 == D)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1,
                     ", ",&refZExpr);
      std::__cxx11::string::append((string *)&funcCall);
      std::__cxx11::string::~string((string *)&vert_1);
    }
    if (GVar4 - GATHERTYPE_OFFSET < 3) {
      std::__cxx11::string::append((char *)&funcCall);
      if (GVar4 == GATHERTYPE_OFFSETS) {
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_410,'\x01');
        std::operator+(&local_268,"ivec2[4](\n",&local_410);
        std::operator+(&local_3b0,&local_268,"\tivec2");
        de::toString<tcu::Vector<int,2>>(&local_288,(de *)value_04->offsets,value_00);
        std::operator+(&local_248,&local_3b0,&local_288);
        std::operator+(&local_390,&local_248,",\n");
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_430,'\x01');
        std::operator+(&local_228,&local_390,&local_430);
        std::operator+(&local_370,&local_228,"\tivec2");
        de::toString<tcu::Vector<int,2>>(&local_2a8,(de *)(value_04->offsets + 1),value_01);
        std::operator+(&local_208,&local_370,&local_2a8);
        std::operator+(&local_350,&local_208,",\n");
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_450,'\x01');
        std::operator+(&local_1e8,&local_350,&local_450);
        std::operator+(&local_330,&local_1e8,"\tivec2");
        de::toString<tcu::Vector<int,2>>(&local_2c8,(de *)(value_04->offsets + 2),value_02);
        std::operator+(&local_1c8,&local_330,&local_2c8);
        std::operator+(&local_4b0,&local_1c8,",\n");
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_470,'\x01');
        std::operator+(&local_4d0,&local_4b0,&local_470);
        std::operator+(&local_500,&local_4d0,"\tivec2");
        de::toString<tcu::Vector<int,2>>(&local_2e8,(de *)(value_04->offsets + 3),value_03);
        std::operator+(&outType,&local_500,&local_2e8);
        std::operator+(&texCoordType_1,&outType,")\n");
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_490,'\x01');
        std::operator+(&texCoordType,&texCoordType_1,&local_490);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1,
                       &texCoordType,"\t");
        std::__cxx11::string::append((string *)&funcCall);
        std::__cxx11::string::~string((string *)&vert_1);
        std::__cxx11::string::~string((string *)&texCoordType);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&texCoordType_1);
        std::__cxx11::string::~string((string *)&outType);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_500);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_268);
        this = &local_410;
      }
      else if (GVar4 == GATHERTYPE_OFFSET_DYNAMIC) {
        if (OVar5 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
LAB_00607bfb:
          std::__cxx11::string::append((char *)&funcCall);
          goto LAB_00607c4a;
        }
        local_4d0._M_dataplus._M_p._0_4_ = local_58c - iVar7;
        de::toString<int>(&outType,(int *)&local_4d0);
        std::operator+(&texCoordType_1,"pixCoord.yx % ivec2(",&outType);
        std::operator+(&texCoordType,&texCoordType_1,") + ");
        local_4b0._M_dataplus._M_p._0_4_ = iVar7;
        de::toString<int>(&local_500,(int *)&local_4b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1,
                       &texCoordType,&local_500);
        std::__cxx11::string::append((string *)&funcCall);
        std::__cxx11::string::~string((string *)&vert_1);
        std::__cxx11::string::~string((string *)&local_500);
        std::__cxx11::string::~string((string *)&texCoordType);
        std::__cxx11::string::~string((string *)&texCoordType_1);
        this = &outType;
      }
      else {
        if (OVar5 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) goto LAB_00607bfb;
        de::toString<tcu::Vector<int,2>>(&texCoordType,(de *)value_04->offsets,value);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1,
                       "ivec2",&texCoordType);
        std::__cxx11::string::append((string *)&funcCall);
        std::__cxx11::string::~string((string *)&vert_1);
        this = &texCoordType;
      }
      std::__cxx11::string::~string((string *)this);
    }
LAB_00607c4a:
    if (IVar6 == IMAGE_BACKING_MODE_SPARSE) {
      std::__cxx11::string::append((char *)&funcCall);
    }
    if (-1 < value_04->componentNdx) {
      de::toString<int>(&texCoordType,&value_04->componentNdx);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1,
                     ", ",&texCoordType);
      std::__cxx11::string::append((string *)&funcCall);
      std::__cxx11::string::~string((string *)&vert_1);
      std::__cxx11::string::~string((string *)&texCoordType);
    }
    std::__cxx11::string::append((char *)&funcCall);
    GVar4 = baseParams->gatherType;
    OVar5 = baseParams->offsetSize;
    IVar6 = baseParams->sparseCase;
    local_4d0._M_dataplus._M_p._0_4_ = iVar13;
    de::toString<int>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1,
                      (int *)&local_4d0);
    std::operator+(&texCoordType_1,"vec",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1);
    std::__cxx11::string::~string((string *)&vert_1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&vert_1);
    dataType_00 = TYPE_LAST;
    if (dataType - TYPE_SAMPLER_2D < 0x18) {
      dataType_00 = *(DataType *)(&DAT_0099bfac + (ulong)(dataType - TYPE_SAMPLER_2D) * 4);
    }
    pcVar11 = glu::getDataTypeName(dataType_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outType,pcVar11,(allocator<char> *)&local_500);
    pcVar11 = "#version 310 es\n";
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1;
    if (IVar6 == IMAGE_BACKING_MODE_SPARSE) {
      pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::operator<<((ostream *)&vert_1,"#version 450\n");
      pcVar11 = "#extension GL_ARB_sparse_texture2 : require\n";
    }
    std::operator<<((ostream *)pbVar12,pcVar11);
    if ((GVar4 & ~GATHERTYPE_OFFSET) == GATHERTYPE_OFFSET_DYNAMIC ||
        OVar5 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
      std::operator<<((ostream *)&vert_1,"#extension GL_EXT_gpu_shader5 : require\n");
    }
    poVar9 = std::operator<<((ostream *)&vert_1,"\nlayout (location = 0) out mediump ");
    poVar9 = std::operator<<(poVar9,(string *)&outType);
    poVar9 = std::operator<<(poVar9," o_color;\n\nlayout (location = 0) in highp ");
    poVar9 = std::operator<<(poVar9,(string *)&texCoordType_1);
    std::operator<<(poVar9," v_texCoord;\n");
    if (local_5a1) {
      std::operator<<((ostream *)&vert_1,"layout (location = 1) in highp vec2 v_normalizedCoord;\n")
      ;
    }
    poVar9 = std::operator<<((ostream *)&vert_1,"\nlayout (binding = ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9,") uniform highp ");
    pcVar11 = glu::getDataTypeName(dataType);
    poVar9 = std::operator<<(poVar9,pcVar11);
    std::operator<<(poVar9," u_sampler;\n");
    if (GVar1 == GATHERTYPE_OFFSET_DYNAMIC) {
      poVar9 = std::operator<<((ostream *)&vert_1,"layout (binding = ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::operator<<(poVar9,") uniform viewportSize { highp vec2 u_viewportSize; };\n");
    }
    if (OVar5 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
      poVar9 = std::operator<<((ostream *)&vert_1,"layout (binding = ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::operator<<(poVar9,") uniform offset { highp ivec2 u_offset; };\n");
    }
    std::operator<<((ostream *)&vert_1,"\nvoid main(void)\n{\n");
    if (GVar1 == GATHERTYPE_OFFSET_DYNAMIC) {
      std::operator<<((ostream *)&vert_1,
                      "\tivec2 pixCoord = ivec2(v_normalizedCoord*u_viewportSize);\n");
    }
    if (IVar6 == IMAGE_BACKING_MODE_SPARSE) {
      poVar9 = std::operator<<((ostream *)&vert_1,"\t");
      poVar9 = std::operator<<(poVar9,(string *)&outType);
      std::operator<<(poVar9," texel;\n");
      poVar9 = std::operator<<((ostream *)&vert_1,"\tint success = ");
      poVar9 = std::operator<<(poVar9,(string *)&funcCall);
      std::operator<<(poVar9,";\n");
      poVar9 = std::operator<<((ostream *)&vert_1,"\tif (sparseTexelsResidentARB(success))\n");
      poVar9 = std::operator<<(poVar9,"\t\to_color = texel;\n");
      poVar9 = std::operator<<(poVar9,"\telse\n");
      poVar9 = std::operator<<(poVar9,"\t\to_color = ");
      poVar9 = std::operator<<(poVar9,(string *)&outType);
      pcVar11 = "(0.0, 0.0, 0.0, 1.0);\n";
    }
    else {
      poVar9 = std::operator<<((ostream *)&vert_1,"\t\to_color = ");
      poVar9 = std::operator<<(poVar9,(string *)&funcCall);
      pcVar11 = ";\n";
    }
    std::operator<<(poVar9,pcVar11);
    std::operator<<((ostream *)&vert_1,"}\n");
    std::__cxx11::stringbuf::str();
    glu::FragmentSource::FragmentSource((FragmentSource *)&texCoordType,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&outType);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vert_1);
    std::__cxx11::string::~string((string *)&texCoordType_1);
    de::toString<int>(&texCoordType_1,&local_584);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert_1,
                   "frag_",&texCoordType_1);
    pPVar10 = ::vk::ProgramCollection<glu::ProgramSources>::add
                        (&programCollection->glslSources,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vert_1);
    glu::ProgramSources::operator<<(pPVar10,(ShaderSource *)&texCoordType);
    std::__cxx11::string::~string((string *)&vert_1);
    std::__cxx11::string::~string((string *)&texCoordType_1);
    std::__cxx11::string::~string((string *)&texCoordType._M_string_length);
    std::__cxx11::string::~string((string *)&funcCall);
    local_584 = local_584 + 1;
  } while( true );
}

Assistant:

void genGatherPrograms (vk::SourceCollections& programCollection, const GatherCaseBaseParams& baseParams, const vector<GatherArgs>& iterations)
{
	const int					numIterations		= (int)iterations.size();
	const string				refZExpr			= "v_normalizedCoord.x";
	const IVec2&				offsetRange			= baseParams.offsetSize != OFFSETSIZE_IMPLEMENTATION_MAXIMUM ? getOffsetRange(baseParams.offsetSize) : IVec2(0);
	const bool					usePixCoord			= baseParams.gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool					useNormalizedCoord	= usePixCoord || isDepthFormat(baseParams.textureFormat);
	const bool					isDynamicOffset		= baseParams.gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool					isShadow			= isDepthFormat(baseParams.textureFormat);
	const glu::DataType			samplerType			= getSamplerType(baseParams.textureType, baseParams.textureFormat);
	const int					numDims				= getNumTextureSamplingDimensions(baseParams.textureType);
	glu::VertexSource			vert				= genVertexShaderSource(requireGpuShader5(baseParams.gatherType, baseParams.offsetSize), numDims, isDynamicOffset || isShadow);

	programCollection.glslSources.add("vert") << vert;

	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		const GatherArgs&		gatherArgs			= iterations[iterNdx];
		const string			funcCall			= genGatherFuncCall(baseParams.gatherType, baseParams.textureFormat, gatherArgs, refZExpr, offsetRange, 1, baseParams.offsetSize, baseParams.sparseCase);
		glu::FragmentSource		frag				= genFragmentShaderSource(requireGpuShader5(baseParams.gatherType, baseParams.offsetSize), numDims, samplerType, funcCall, useNormalizedCoord, usePixCoord, baseParams.offsetSize, baseParams.sparseCase);

		programCollection.glslSources.add("frag_" + de::toString(iterNdx)) << frag;
	}
}